

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall
cs::statement_struct::statement_struct
          (statement_struct *this,string *name,tree_type<cs::token_base_*> *tree,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *method,context_t *c,
          token_base *ptr)

{
  string *in_RSI;
  undefined8 *in_RDI;
  shared_ptr<cs::context_type> *in_stack_fffffffffffffef8;
  token_base *in_stack_ffffffffffffff00;
  context_t *in_stack_ffffffffffffff08;
  statement_base *this_00;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_ffffffffffffff50;
  tree_type<cs::token_base_*> *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  context_t *in_stack_ffffffffffffff68;
  struct_builder *in_stack_ffffffffffffff70;
  string local_80 [56];
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_ffffffffffffffb8;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_ffffffffffffffc0;
  
  this_00 = (statement_base *)&stack0xffffffffffffffc0;
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  statement_base::statement_base(this_00,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x24368f);
  *in_RDI = &PTR__statement_struct_003be6b0;
  std::__cxx11::string::string((string *)(in_RDI + 4),in_RSI);
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::__cxx11::string::string(local_80,in_RSI);
  tree_type<cs::token_base_*>::tree_type
            ((tree_type<cs::token_base_*> *)in_stack_ffffffffffffff00,
             (tree_type<cs::token_base_*> *)in_stack_fffffffffffffef8);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  struct_builder::struct_builder
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
            (in_stack_ffffffffffffff50);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x24375f);
  std::__cxx11::string::~string(local_80);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x243779);
  tree_type<cs::token_base_*>::tree_type
            ((tree_type<cs::token_base_*> *)(in_RDI + 0x1b),
             (tree_type<cs::token_base_*> *)in_stack_fffffffffffffef8);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

statement_struct(const std::string &name, const tree_type<token_base *> &tree,
		                 const std::deque<statement_base *> &method, const context_t &c, token_base *ptr)
			: statement_base(c,
			                 ptr),
			  mName(name),
			  mBuilder(c, name,
			           tree,
			           method),
			  mParent(tree),
			  mBlock(method) {}